

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O1

int __thiscall gdscpp::calculate_STR_bounding_box(gdscpp *this,int structure_index,int *destination)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  pointer pgVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  bool bVar15;
  uint uVar16;
  pointer pgVar17;
  int *piVar18;
  mapped_type *pmVar19;
  int iVar20;
  pointer pgVar21;
  pointer pgVar22;
  long lVar23;
  ulong uVar24;
  pointer pgVar25;
  int iVar26;
  int *piVar27;
  int *piVar28;
  int *piVar29;
  int unaff_EBP;
  int iVar30;
  int *piVar31;
  int iVar32;
  int *piVar33;
  int *piVar34;
  int *piVar35;
  int iVar36;
  int *piVar37;
  int *piVar38;
  pointer pgVar39;
  pointer pgVar40;
  int unaff_R13D;
  int unaff_R14D;
  int unaff_R15D;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  int local_290;
  double local_230;
  undefined1 local_1d0 [72];
  _Alloc_hider local_188;
  char local_178 [16];
  undefined1 local_168 [72];
  _Alloc_hider local_120;
  char local_110 [16];
  undefined1 local_100 [72];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [72];
  _Alloc_hider local_50;
  char local_40 [16];
  
  pgVar17 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
            super__Vector_impl_data._M_start;
  pgVar21 = *(pointer *)
             &pgVar17[structure_index].BOUNDARY.
              super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl;
  if (pgVar21 ==
      *(pointer *)
       ((long)&pgVar17[structure_index].BOUNDARY.
               super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl + 8)) {
    bVar15 = false;
  }
  else {
    bVar15 = false;
    do {
      if (bVar15) {
        local_100._8_4_ = pgVar21->dataType;
        local_100._0_4_ = pgVar21->plex;
        local_100._4_4_ = pgVar21->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_100 + 0x10),&pgVar21->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_100 + 0x28),&pgVar21->yCor);
        local_100._64_4_ = pgVar21->propattr;
        local_b8._M_p = local_a8;
        pcVar5 = (pgVar21->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar5,pcVar5 + (pgVar21->propvalue)._M_string_length);
        iVar20 = *(int *)local_100._16_8_;
        iVar26 = *(int *)local_100._40_8_;
        iVar32 = iVar20;
        iVar36 = iVar26;
        piVar27 = (int *)local_100._40_8_;
        for (piVar35 = (int *)local_100._16_8_; piVar35 != (int *)local_100._24_8_;
            piVar35 = piVar35 + 1) {
          iVar30 = *piVar35;
          if (iVar30 < iVar32) {
            iVar32 = iVar30;
          }
          if (iVar20 < iVar30) {
            iVar20 = iVar30;
          }
          iVar30 = *piVar27;
          if (iVar30 < iVar36) {
            iVar36 = iVar30;
          }
          if (iVar26 < iVar30) {
            iVar26 = iVar30;
          }
          piVar27 = piVar27 + 1;
        }
        gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_100);
        if (iVar32 < unaff_R13D) {
          unaff_R13D = iVar32;
        }
        if (iVar36 < unaff_R15D) {
          unaff_R15D = iVar36;
        }
        if (unaff_EBP < iVar20) {
          unaff_EBP = iVar20;
        }
        if (unaff_R14D < iVar26) {
          unaff_R14D = iVar26;
        }
      }
      else {
        local_98._8_4_ = pgVar21->dataType;
        local_98._0_4_ = pgVar21->plex;
        local_98._4_4_ = pgVar21->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_98 + 0x10),&pgVar21->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_98 + 0x28),&pgVar21->yCor);
        local_98._64_4_ = pgVar21->propattr;
        local_50._M_p = local_40;
        pcVar5 = (pgVar21->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar5,pcVar5 + (pgVar21->propvalue)._M_string_length);
        unaff_R13D = *(int *)local_98._16_8_;
        unaff_R15D = *(int *)local_98._40_8_;
        unaff_EBP = unaff_R13D;
        unaff_R14D = unaff_R15D;
        piVar27 = (int *)local_98._40_8_;
        for (piVar35 = (int *)local_98._16_8_; piVar35 != (int *)local_98._24_8_;
            piVar35 = piVar35 + 1) {
          iVar20 = *piVar35;
          if (iVar20 < unaff_R13D) {
            unaff_R13D = iVar20;
          }
          if (unaff_EBP < iVar20) {
            unaff_EBP = iVar20;
          }
          iVar20 = *piVar27;
          if (iVar20 < unaff_R15D) {
            unaff_R15D = iVar20;
          }
          if (unaff_R14D < iVar20) {
            unaff_R14D = iVar20;
          }
          piVar27 = piVar27 + 1;
        }
        gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_98);
        bVar15 = true;
      }
      pgVar21 = pgVar21 + 1;
      pgVar17 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (pgVar21 !=
             *(pointer *)
              ((long)&pgVar17[structure_index].BOUNDARY.
                      super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl + 8));
  }
  pgVar22 = *(pointer *)
             &pgVar17[structure_index].BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>.
              _M_impl;
  pgVar17 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pgVar22 !=
      *(pointer *)
       ((long)&pgVar17[structure_index].BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>.
               _M_impl + 8)) {
    do {
      if (bVar15) {
        local_1d0._8_4_ = pgVar22->boxtype;
        local_1d0._0_4_ = pgVar22->plex;
        local_1d0._4_4_ = pgVar22->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_1d0 + 0x10),&pgVar22->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_1d0 + 0x28),&pgVar22->yCor);
        local_1d0._64_4_ = pgVar22->propattr;
        local_188._M_p = local_178;
        pcVar5 = (pgVar22->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,pcVar5,pcVar5 + (pgVar22->propvalue)._M_string_length);
        iVar20 = *(int *)local_1d0._16_8_;
        iVar26 = *(int *)local_1d0._40_8_;
        iVar32 = iVar20;
        iVar36 = iVar26;
        piVar27 = (int *)local_1d0._40_8_;
        for (piVar35 = (int *)local_1d0._16_8_; piVar35 != (int *)local_1d0._24_8_;
            piVar35 = piVar35 + 1) {
          iVar30 = *piVar35;
          if (iVar30 < iVar32) {
            iVar32 = iVar30;
          }
          if (iVar20 < iVar30) {
            iVar20 = iVar30;
          }
          iVar30 = *piVar27;
          if (iVar30 < iVar36) {
            iVar36 = iVar30;
          }
          if (iVar26 < iVar30) {
            iVar26 = iVar30;
          }
          piVar27 = piVar27 + 1;
        }
        gdsBOX::~gdsBOX((gdsBOX *)local_1d0);
        if (iVar32 < unaff_R13D) {
          unaff_R13D = iVar32;
        }
        if (iVar36 < unaff_R15D) {
          unaff_R15D = iVar36;
        }
        if (unaff_EBP < iVar20) {
          unaff_EBP = iVar20;
        }
        if (unaff_R14D < iVar26) {
          unaff_R14D = iVar26;
        }
      }
      else {
        local_168._8_4_ = pgVar22->boxtype;
        local_168._0_4_ = pgVar22->plex;
        local_168._4_4_ = pgVar22->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_168 + 0x10),&pgVar22->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_168 + 0x28),&pgVar22->yCor);
        local_168._64_4_ = pgVar22->propattr;
        local_120._M_p = local_110;
        pcVar5 = (pgVar22->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,pcVar5,pcVar5 + (pgVar22->propvalue)._M_string_length);
        unaff_EBP = *(int *)local_168._16_8_;
        unaff_R14D = *(int *)local_168._40_8_;
        unaff_R13D = unaff_EBP;
        unaff_R15D = unaff_R14D;
        piVar27 = (int *)local_168._40_8_;
        for (piVar35 = (int *)local_168._16_8_; piVar35 != (int *)local_168._24_8_;
            piVar35 = piVar35 + 1) {
          iVar20 = *piVar35;
          if (iVar20 < unaff_R13D) {
            unaff_R13D = iVar20;
          }
          if (unaff_EBP < iVar20) {
            unaff_EBP = iVar20;
          }
          iVar20 = *piVar27;
          if (iVar20 < unaff_R15D) {
            unaff_R15D = iVar20;
          }
          if (unaff_R14D < iVar20) {
            unaff_R14D = iVar20;
          }
          piVar27 = piVar27 + 1;
        }
        gdsBOX::~gdsBOX((gdsBOX *)local_168);
        bVar15 = true;
      }
      pgVar22 = pgVar22 + 1;
      pgVar17 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (pgVar22 !=
             *(pointer *)
              ((long)&pgVar17[structure_index].BOX.
                      super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl + 8));
  }
  pgVar6 = *(pointer *)
            ((long)&pgVar17[structure_index].PATH.
                    super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl + 8);
  local_290 = unaff_R13D;
  for (pgVar39 = pgVar17[structure_index].PATH.super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>
                 ._M_impl.super__Vector_impl_data._M_start; pgVar39 != pgVar6; pgVar39 = pgVar39 + 1
      ) {
    dVar41 = round((double)pgVar39->width * 0.5);
    piVar35 = (pgVar39->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar27 = *(pointer *)
               ((long)&(pgVar39->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    piVar28 = piVar35 + 1;
    piVar18 = piVar28;
    piVar33 = piVar35;
    piVar37 = piVar35;
    if (piVar28 != piVar27 && piVar35 != piVar27) {
      do {
        piVar33 = piVar18;
        if (*piVar37 <= *piVar18) {
          piVar33 = piVar37;
        }
        piVar18 = piVar18 + 1;
        piVar37 = piVar33;
      } while (piVar18 != piVar27);
    }
    piVar18 = (pgVar39->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar37 = *(pointer *)
               ((long)&(pgVar39->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    piVar38 = piVar18 + 1;
    piVar29 = piVar18;
    piVar31 = piVar18;
    piVar34 = piVar38;
    if (piVar38 != piVar37 && piVar18 != piVar37) {
      do {
        piVar29 = piVar34;
        if (*piVar31 <= *piVar34) {
          piVar29 = piVar31;
        }
        piVar34 = piVar34 + 1;
        piVar31 = piVar29;
      } while (piVar34 != piVar37);
    }
    if (piVar28 != piVar27 && piVar35 != piVar27) {
      do {
        piVar31 = piVar28;
        if (*piVar28 <= *piVar35) {
          piVar31 = piVar35;
        }
        piVar35 = piVar31;
        piVar28 = piVar28 + 1;
      } while (piVar28 != piVar27);
    }
    iVar20 = (int)dVar41;
    iVar26 = *piVar35 + iVar20;
    piVar35 = piVar18;
    if (piVar38 != piVar37 && piVar18 != piVar37) {
      do {
        piVar18 = piVar38;
        if (*piVar38 <= *piVar35) {
          piVar18 = piVar35;
        }
        piVar38 = piVar38 + 1;
        piVar35 = piVar18;
      } while (piVar38 != piVar37);
    }
    iVar36 = *piVar33 - iVar20;
    iVar32 = *piVar29 - iVar20;
    iVar20 = iVar20 + *piVar18;
    if (!bVar15) {
      bVar15 = true;
      unaff_EBP = iVar26;
      local_290 = iVar36;
      unaff_R15D = iVar32;
      unaff_R14D = iVar20;
    }
    if (iVar36 < local_290) {
      local_290 = iVar36;
    }
    if (unaff_EBP < iVar26) {
      unaff_EBP = iVar26;
    }
    if (iVar32 < unaff_R15D) {
      unaff_R15D = iVar32;
    }
    if (unaff_R14D < iVar20) {
      unaff_R14D = iVar20;
    }
  }
  pgVar25 = pgVar17[structure_index].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pgVar25 ==
        *(pointer *)
         ((long)&(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                 super__Vector_impl_data._M_start[structure_index].SREF.
                 super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl + 8)) break;
    pmVar19 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->STR_Lookup,&pgVar25->name);
    iVar20 = *pmVar19;
    lVar23 = (long)iVar20;
    if (lVar23 == 1000000000) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: reference to structure with no name.",0x2b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Terminating SREF bounding box check.",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    else {
      pgVar17 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar26 = pgVar17[lVar23].bounding_box[0];
      iVar32 = pgVar17[lVar23].bounding_box[1];
      iVar36 = pgVar17[lVar23].bounding_box[2];
      iVar30 = pgVar17[lVar23].bounding_box[3];
      if (((iVar26 == 0 && iVar32 == 0) && iVar36 == 0) && iVar30 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Warning: Inaccuracy due to structures not being initialized.",0x3c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      iVar1 = -iVar32;
      iVar2 = -iVar30;
      if (pgVar25->reflection == false) {
        iVar1 = iVar30;
        iVar2 = iVar32;
      }
      dVar44 = (double)iVar26;
      dVar45 = (double)iVar2;
      local_230 = (double)iVar36;
      dVar7 = (double)iVar1;
      dVar41 = pgVar25->scale;
      if ((dVar41 != 1.0) || (NAN(dVar41))) {
        dVar44 = dVar44 * dVar41;
        local_230 = local_230 * dVar41;
        dVar45 = dVar45 * dVar41;
        dVar7 = dVar7 * dVar41;
      }
      uVar16 = (uint)pgVar25->angle;
      if (0 < (int)uVar16) {
        uVar24 = 0x167;
        if (0x167 < (int)uVar16) {
          uVar24 = (ulong)uVar16;
        }
        dVar41 = ((double)(int)((uint)(uVar24 * 0xb60b60b7 >> 0x28) * -0x168 + uVar16) *
                 3.141592653589) / 180.0;
        dVar8 = cos(dVar41);
        dVar14 = sin(dVar41);
        dVar9 = dVar8 * dVar44 - dVar14 * dVar45;
        dVar8 = sin(dVar41);
        dVar14 = cos(dVar41);
        dVar8 = dVar8 * dVar44 + dVar14 * dVar45;
        dVar45 = cos(dVar41);
        dVar44 = sin(dVar41);
        dVar14 = dVar45 * local_230 - dVar44 * dVar7;
        dVar45 = sin(dVar41);
        dVar41 = cos(dVar41);
        dVar41 = dVar45 * local_230 + dVar41 * dVar7;
        dVar44 = dVar14;
        local_230 = dVar9;
        if (dVar9 <= dVar14) {
          dVar44 = dVar9;
          local_230 = dVar14;
        }
        dVar45 = dVar41;
        dVar7 = dVar8;
        if (dVar8 <= dVar41) {
          dVar45 = dVar8;
          dVar7 = dVar41;
        }
      }
      dVar41 = round(dVar44);
      iVar26 = pgVar25->xCor;
      iVar32 = pgVar25->yCor;
      iVar36 = (int)dVar41 + iVar26;
      dVar41 = round(dVar45);
      iVar30 = (int)dVar41 + iVar32;
      dVar41 = round(local_230);
      iVar26 = (int)dVar41 + iVar26;
      dVar41 = round(dVar7);
      iVar32 = (int)dVar41 + iVar32;
      if (!bVar15) {
        bVar15 = true;
        local_290 = iVar36;
        unaff_R15D = iVar30;
        unaff_R14D = iVar32;
        unaff_EBP = iVar26;
      }
      if (iVar36 < local_290) {
        local_290 = iVar36;
      }
      if (unaff_EBP < iVar26) {
        unaff_EBP = iVar26;
      }
      if (iVar30 < unaff_R15D) {
        unaff_R15D = iVar30;
      }
      if (unaff_R14D < iVar32) {
        unaff_R14D = iVar32;
      }
      pgVar25 = pgVar25 + 1;
    }
  } while (iVar20 != 1000000000);
  pgVar40 = *(pointer *)
             &(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
              super__Vector_impl_data._M_start[structure_index].AREF.
              super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl;
  do {
    if (pgVar40 ==
        *(pointer *)
         ((long)&(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                 super__Vector_impl_data._M_start[structure_index].AREF.
                 super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl + 8)) break;
    pmVar19 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->STR_Lookup,&pgVar40->name);
    iVar20 = *pmVar19;
    lVar23 = (long)iVar20;
    if (lVar23 == 1000000000) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: reference to structure with no name.",0x2b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Terminating AREF bounding box check.",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    else {
      pgVar17 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar26 = pgVar17[lVar23].bounding_box[0];
      iVar32 = pgVar17[lVar23].bounding_box[1];
      iVar36 = pgVar17[lVar23].bounding_box[2];
      iVar30 = pgVar17[lVar23].bounding_box[3];
      if (((iVar26 == 0 && iVar32 == 0) && iVar36 == 0) && iVar30 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Warning: Structure being referenced for AREF does not have an initialized",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "bounding box. Therefore, bounding boxes of references will be inaccurate.",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Calculate bounding boxes from the lowest level (unreferenced) upwards.",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      dVar41 = pgVar40->angle;
      dVar7 = (double)pgVar40->xCor;
      dVar45 = (double)pgVar40->yCor;
      iVar1 = pgVar40->xCorRow;
      iVar2 = pgVar40->yCorRow;
      iVar3 = pgVar40->xCorCol;
      iVar4 = pgVar40->yCorCol;
      dVar14 = ((double)-(int)dVar41 * 3.141592653589) / 180.0;
      dVar44 = sin(dVar14);
      dVar8 = cos(dVar14);
      dVar44 = round((dVar8 * ((double)iVar1 - dVar7) - ((double)iVar2 - dVar45) * dVar44) + dVar7);
      dVar8 = sin(dVar14);
      dVar14 = cos(dVar14);
      dVar8 = round(dVar14 * ((double)iVar4 - dVar45) + ((double)iVar3 - dVar7) * dVar8 + dVar45);
      iVar1 = pgVar40->colCnt;
      iVar2 = pgVar40->rowCnt;
      dVar41 = ((double)(int)dVar41 * 3.141592653589) / 180.0;
      dVar14 = sin(dVar41);
      dVar9 = cos(dVar41);
      dVar10 = dVar7 - dVar7;
      dVar42 = dVar45 - dVar45;
      dVar11 = round((dVar10 * dVar9 - dVar14 * dVar42) + dVar7);
      dVar14 = round(dVar9 * dVar42 + dVar10 * dVar14 + dVar45);
      dVar9 = sin(dVar41);
      dVar12 = cos(dVar41);
      dVar44 = ((double)(iVar36 - iVar26) + (dVar44 - (dVar44 - dVar7) / (double)iVar1)) - dVar7;
      dVar13 = round((dVar44 * dVar12 - dVar9 * dVar42) + dVar7);
      dVar9 = round(dVar12 * dVar42 + dVar44 * dVar9 + dVar45);
      dVar12 = sin(dVar41);
      dVar42 = cos(dVar41);
      dVar43 = ((dVar8 - (dVar8 - dVar45) / (double)iVar2) + (double)(iVar30 - iVar32)) - dVar45;
      dVar8 = round((dVar44 * dVar42 - dVar12 * dVar43) + dVar7);
      dVar44 = round(dVar42 * dVar43 + dVar44 * dVar12 + dVar45);
      dVar12 = sin(dVar41);
      dVar41 = cos(dVar41);
      dVar7 = round((dVar10 * dVar41 - dVar12 * dVar43) + dVar7);
      dVar41 = round(dVar41 * dVar43 + dVar10 * dVar12 + dVar45);
      iVar26 = (int)dVar11;
      if (dVar13 < (double)(int)dVar11) {
        iVar26 = (int)dVar13;
      }
      if (dVar8 < (double)iVar26) {
        iVar26 = (int)dVar8;
      }
      iVar32 = (int)dVar11;
      if ((double)(int)dVar11 < dVar13) {
        iVar32 = (int)dVar13;
      }
      if ((double)iVar32 < dVar8) {
        iVar32 = (int)dVar8;
      }
      iVar36 = (int)dVar7;
      if ((double)iVar26 <= dVar7 && dVar7 <= (double)iVar32) {
        iVar36 = iVar26;
      }
      iVar26 = (int)dVar14;
      if (dVar9 < (double)(int)dVar14) {
        iVar26 = (int)dVar9;
      }
      if (dVar44 < (double)iVar26) {
        iVar26 = (int)dVar44;
      }
      if (dVar41 < (double)iVar26) {
        iVar26 = (int)dVar41;
      }
      iVar30 = (int)dVar14;
      if ((double)(int)dVar14 < dVar9) {
        iVar30 = (int)dVar9;
      }
      if ((double)iVar30 < dVar44) {
        iVar30 = (int)dVar44;
      }
      if ((double)iVar30 < dVar41) {
        iVar30 = (int)dVar41;
      }
      if (!bVar15) {
        bVar15 = true;
        unaff_EBP = iVar32;
        unaff_R15D = iVar26;
        unaff_R14D = iVar30;
        local_290 = iVar36;
      }
      if (iVar36 < local_290) {
        local_290 = iVar36;
      }
      if (unaff_EBP < iVar32) {
        unaff_EBP = iVar32;
      }
      if (iVar26 < unaff_R15D) {
        unaff_R15D = iVar26;
      }
      if (unaff_R14D < iVar30) {
        unaff_R14D = iVar30;
      }
      pgVar40 = pgVar40 + 1;
    }
  } while (iVar20 != 1000000000);
  *destination = local_290;
  destination[1] = unaff_R15D;
  destination[2] = unaff_EBP;
  destination[3] = unaff_R14D;
  return 0;
}

Assistant:

int gdscpp::calculate_STR_bounding_box(int structure_index, int *destination)
{
  int bound_box[4]; // xmin, ymin, xmax, ymax of structure
  bool box_initialized = false;
  // ======================= Look through boundaries =======================
  auto boundary_iterator = STR[structure_index].BOUNDARY.begin();
  while (boundary_iterator != STR[structure_index].BOUNDARY.end()) {
    int STR_bound_box[4];
    if (box_initialized == false) {
      // Initialize bounding box
      fetch_boundary_bounding_box(*boundary_iterator, bound_box);
      box_initialized = true;
    } else {
      // Compare for minimum/maximums
      fetch_boundary_bounding_box(*boundary_iterator, STR_bound_box);
      if (STR_bound_box[0] < bound_box[0])
        bound_box[0] = STR_bound_box[0];
      if (STR_bound_box[1] < bound_box[1])
        bound_box[1] = STR_bound_box[1];
      if (STR_bound_box[2] > bound_box[2])
        bound_box[2] = STR_bound_box[2];
      if (STR_bound_box[3] > bound_box[3])
        bound_box[3] = STR_bound_box[3];
    }
    boundary_iterator++;
  }
  // ========================= Look through boxes ==========================
  auto box_iter = STR[structure_index].BOX.begin();
  while (box_iter != STR[structure_index].BOX.end()) {
    int BOX_bound_box[4];
    if (box_initialized == false) {
      fetch_box_bounding_box(*box_iter, bound_box);
      box_initialized = true;
    } else {
      fetch_box_bounding_box(*box_iter, BOX_bound_box);
      if (BOX_bound_box[0] < bound_box[0])
        bound_box[0] = BOX_bound_box[0];
      if (BOX_bound_box[1] < bound_box[1])
        bound_box[1] = BOX_bound_box[1];
      if (BOX_bound_box[2] > bound_box[2])
        bound_box[2] = BOX_bound_box[2];
      if (BOX_bound_box[3] > bound_box[3])
        bound_box[3] = BOX_bound_box[3];
    }
    box_iter++;
  }
  // ========================= Look through paths ==========================
  auto path_iter = STR[structure_index].PATH.begin();
  while (path_iter != STR[structure_index].PATH.end()) {
    // Neglect path type. Simplify work by assuming max half-width protrusion.
    // Worst case scenario is that the bounding box is ever so slightly
    // bigger than actually needed for a flat-cap situation.
    int offset = (int)(round(((double)path_iter->width * 0.5)));
    int local_bbox[4] = {
        (*min_element(path_iter->xCor.begin(), path_iter->xCor.end()) - offset),
        (*min_element(path_iter->yCor.begin(), path_iter->yCor.end()) - offset),
        (*max_element(path_iter->xCor.begin(), path_iter->xCor.end()) + offset),
        (*max_element(path_iter->yCor.begin(), path_iter->yCor.end()) +
         offset)};
    if (box_initialized == false) {
      bound_box[0] = local_bbox[0];
      bound_box[1] = local_bbox[1];
      bound_box[2] = local_bbox[2];
      bound_box[3] = local_bbox[3];
      box_initialized = true;
    }
    if (local_bbox[0] < bound_box[0])
      bound_box[0] = local_bbox[0]; // new minimum
    if (local_bbox[2] > bound_box[2])
      bound_box[2] = local_bbox[2]; // new maximum
    if (local_bbox[1] < bound_box[1])
      bound_box[1] = local_bbox[1];
    if (local_bbox[3] > bound_box[3])
      bound_box[3] = local_bbox[3];
    path_iter++;
  }
  // ================== Look through structure references ==================
  auto SREF_iter = STR[structure_index].SREF.begin();
  while (SREF_iter != STR[structure_index].SREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[SREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating SREF bounding box check." << endl;
      break;
    }
    int referred_bound_box[4];
    referred_bound_box[0] = STR[target_structure_index].bounding_box[0];
    referred_bound_box[1] = STR[target_structure_index].bounding_box[1];
    referred_bound_box[2] = STR[target_structure_index].bounding_box[2];
    referred_bound_box[3] = STR[target_structure_index].bounding_box[3];

    if ((referred_bound_box[0] == 0) && (referred_bound_box[1] == 0) &&
        (referred_bound_box[2] == 0) && (referred_bound_box[3] == 0)) {
      // cout << "Warning: Structure being referenced does not have an
      // initialized"
      //      << endl;
      // cout << "bounding box. Therefore, bounding boxes of references will be
      // "
      //         "inaccurate."
      //      << endl;
      // cout << "Calculate bounding boxes from the lowest level (unreferenced)
      // "
      //         "upwards."
      //      << endl;
      cout << "Warning: Inaccuracy due to structures not being initialized."
           << endl;
    }
    if (SREF_iter->reflection == true) // Reflect about x-axis
    {
      // Reflect the box about x-axis and swap because max becomes min
      int placeholder = referred_bound_box[1];
      referred_bound_box[1] = -1 * referred_bound_box[3];
      referred_bound_box[3] = -1 * placeholder;
    }
    double x_1 = referred_bound_box[0];
    double y_1 = referred_bound_box[1];
    double x_2 = referred_bound_box[2];
    double y_2 = referred_bound_box[3];
    if (SREF_iter->scale != 1) // Multiply by scale factor
    {
      x_1 = x_1 * SREF_iter->scale;
      x_2 = x_2 * SREF_iter->scale;
      y_1 = y_1 * SREF_iter->scale;
      y_2 = y_2 * SREF_iter->scale;
    }
    // Rotate
    int angle = SREF_iter->angle;
    if (angle > 0) {
      while (angle >= 360) {
        angle = angle - 360;
      }
      double x_1_new = x_1 * cos(angle * 3.141592653589 / 180) -
                       y_1 * sin(angle * 3.141592653589 / 180);
      double y_1_new = x_1 * sin(angle * 3.141592653589 / 180) +
                       y_1 * cos(angle * 3.141592653589 / 180);
      double x_2_new = x_2 * cos(angle * 3.141592653589 / 180) -
                       y_2 * sin(angle * 3.141592653589 / 180);
      double y_2_new = x_2 * sin(angle * 3.141592653589 / 180) +
                       y_2 * cos(angle * 3.141592653589 / 180);
      x_1 = x_1_new;
      y_1 = y_1_new;
      x_2 = x_2_new;
      y_2 = y_2_new;
      // convert back to vertical box by getting the new minimum and maximum
      if (x_1 > x_2) {
        double temp_holder = x_2;
        x_2 = x_1;
        x_1 = temp_holder;
      }
      if (y_1 > y_2) {
        double temp_holder2 = y_2;
        y_2 = y_1;
        y_1 = temp_holder2;
      }
    }
    // Offset shape according to translation
    referred_bound_box[0] = (int)(round(x_1)) + SREF_iter->xCor;
    referred_bound_box[1] = (int)(round(y_1)) + SREF_iter->yCor;
    referred_bound_box[2] = (int)(round(x_2)) + SREF_iter->xCor;
    referred_bound_box[3] = (int)(round(y_2)) + SREF_iter->yCor;

    if (box_initialized == false) {
      bound_box[0] = referred_bound_box[0];
      bound_box[1] = referred_bound_box[1];
      bound_box[2] = referred_bound_box[2];
      bound_box[3] = referred_bound_box[3];
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (referred_bound_box[0] < bound_box[0])
      bound_box[0] = referred_bound_box[0]; // new minimum
    if (referred_bound_box[2] > bound_box[2])
      bound_box[2] = referred_bound_box[2]; // new maximum
    if (referred_bound_box[1] < bound_box[1])
      bound_box[1] = referred_bound_box[1];
    if (referred_bound_box[3] > bound_box[3])
      bound_box[3] = referred_bound_box[3];

    SREF_iter++;
  }
  // ==================== Look through array references ====================
  auto AREF_iter = STR[structure_index].AREF.begin();
  while (AREF_iter != STR[structure_index].AREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[AREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating AREF bounding box check." << endl;
      break;
    }
    // fetch bounding box of the array reference structure
    int a_referred_bound_box[4] = {STR[target_structure_index].bounding_box[0],
                                   STR[target_structure_index].bounding_box[1],
                                   STR[target_structure_index].bounding_box[2],
                                   STR[target_structure_index].bounding_box[3]};
    if ((a_referred_bound_box[0] == 0) && (a_referred_bound_box[1] == 0) &&
        (a_referred_bound_box[2] == 0) && (a_referred_bound_box[3] == 0)) {
      cout << "Warning: Structure being referenced for AREF does not have an "
              "initialized"
           << endl;
      cout << "bounding box. Therefore, bounding boxes of references will be "
              "inaccurate."
           << endl;
      cout << "Calculate bounding boxes from the lowest level (unreferenced) "
              "upwards."
           << endl;
    }
    // Rotate array reference back to original dimensions
    POINT cor, corRow, corCol, true_max;
    POINT enclosed_array[4];
    int aref_angle = AREF_iter->angle;
    cor.x = (double)AREF_iter->xCor;
    cor.y = (double)AREF_iter->yCor;
    corRow.x = (double)AREF_iter->xCorRow;
    corRow.y = (double)AREF_iter->yCorRow;
    corCol.x = (double)AREF_iter->xCorCol;
    corCol.y = (double)AREF_iter->yCorCol;
    rotate_point(cor.x, cor.y, (-aref_angle), corRow);
    rotate_point(cor.x, cor.y, (-aref_angle), corCol);
    // Determine the true endpoints (without blank space at end)
    int referred_structure_width =
        a_referred_bound_box[2] - a_referred_bound_box[0];
    int referred_structure_height =
        a_referred_bound_box[3] - a_referred_bound_box[1];
    double column_spacing = (corRow.x - cor.x) / AREF_iter->colCnt;
    double row_spacing = (corCol.y - cor.y) / AREF_iter->rowCnt;
    true_max.x = corRow.x - column_spacing + referred_structure_width;
    true_max.y = corCol.y - row_spacing + referred_structure_height;
    enclosed_array[0].x = cor.x;
    enclosed_array[0].y = cor.y;
    enclosed_array[1].x = true_max.x;
    enclosed_array[1].y = cor.y;
    enclosed_array[2].x = true_max.x;
    enclosed_array[2].y = true_max.y;
    enclosed_array[3].x = cor.x;
    enclosed_array[3].y = true_max.y;
    // Rotate the 4 points of the box to their correct positions
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[0]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[1]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[2]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[3]);
    // Determine min/maxes for new box
    int x_min, y_min, x_max, y_max;
    x_min = (int)enclosed_array[0].x;
    if (enclosed_array[1].x < (double)x_min)
      x_min = (int)enclosed_array[1].x;
    if (enclosed_array[2].x < (double)x_min)
      x_min = (int)enclosed_array[2].x;
    if (enclosed_array[3].x < (double)x_min)
      x_min = (int)enclosed_array[3].x;

    x_max = (int)enclosed_array[0].x;
    if (enclosed_array[1].x > (double)x_max)
      x_max = (int)enclosed_array[1].x;
    if (enclosed_array[2].x > (double)x_max)
      x_max = (int)enclosed_array[2].x;
    if (enclosed_array[3].x > (double)x_max)
      x_min = (int)enclosed_array[3].x;

    y_min = (int)enclosed_array[0].y;
    if (enclosed_array[1].y < (double)y_min)
      y_min = (int)enclosed_array[1].y;
    if (enclosed_array[2].y < (double)y_min)
      y_min = (int)enclosed_array[2].y;
    if (enclosed_array[3].y < (double)y_min)
      y_min = (int)enclosed_array[3].y;

    y_max = (int)enclosed_array[0].y;
    if (enclosed_array[1].y > (double)y_max)
      y_max = (int)enclosed_array[1].y;
    if (enclosed_array[2].y > (double)y_max)
      y_max = (int)enclosed_array[2].y;
    if (enclosed_array[3].y > (double)y_max)
      y_max = (int)enclosed_array[3].y;

    // Do the comparison against the structure bounding box
    if (box_initialized == false) {
      bound_box[0] = x_min;
      bound_box[1] = y_min;
      bound_box[2] = x_max;
      bound_box[3] = y_max;
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (x_min < bound_box[0])
      bound_box[0] = x_min; // new minimum
    if (x_max > bound_box[2])
      bound_box[2] = x_max; // new maximum
    if (y_min < bound_box[1])
      bound_box[1] = y_min;
    if (y_max > bound_box[3])
      bound_box[3] = y_max;
    AREF_iter++;
  }
  // =============== Send the bounding box to specified array ==============
  destination[0] = bound_box[0];
  destination[1] = bound_box[1];
  destination[2] = bound_box[2];
  destination[3] = bound_box[3];
  return EXIT_SUCCESS;
}